

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

FString * __thiscall FString::operator+=(FString *this,char *tail)

{
  uint uVar1;
  char *pcVar2;
  size_t __n;
  
  uVar1 = *(uint *)(this->Chars + -0xc);
  __n = strlen(tail);
  ReallocBuffer(this,__n + uVar1);
  pcVar2 = this->Chars;
  memcpy(pcVar2 + uVar1,tail,__n);
  (pcVar2 + uVar1)[__n] = '\0';
  return this;
}

Assistant:

FString &FString::operator += (const char *tail)
{
	size_t len1 = Len();
	size_t len2 = strlen(tail);
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail, len2);
	return *this;
}